

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

LabelInstr * __thiscall Lowerer::EnsureEpilogueLabel(Lowerer *this)

{
  IRKind IVar1;
  LabelInstr *this_00;
  code *pcVar2;
  bool bVar3;
  JITTimeFunctionBody *this_01;
  undefined4 *puVar4;
  LabelInstr *instr;
  
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar3 = JITTimeFunctionBody::IsCoroutine(this_01);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x387e,"(!this->m_func->GetJITFunctionBody()->IsCoroutine())",
                       "!this->m_func->GetJITFunctionBody()->IsCoroutine()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_00 = (LabelInstr *)this->m_func->m_exitInstr->m_prev;
  IVar1 = (this_00->super_Instr).m_kind;
  instr = this_00;
  if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
    instr = IR::LabelInstr::New(Label,this->m_func,false);
    instr->m_name = L"Epilogue";
    IR::Instr::InsertAfter((Instr *)this_00,&instr->super_Instr);
  }
  return instr;
}

Assistant:

IR::LabelInstr *
Lowerer::EnsureEpilogueLabel() const
{
    Assert(!this->m_func->GetJITFunctionBody()->IsCoroutine());
    IR::Instr* exitPrevInstr = this->m_func->m_exitInstr->m_prev;
    if (exitPrevInstr->IsLabelInstr())
    {
        return exitPrevInstr->AsLabelInstr();
    }
    else
    {
        IR::LabelInstr* epilogueLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, false);
        LABELNAMESET(epilogueLabel, "Epilogue");
        exitPrevInstr->InsertAfter(epilogueLabel);
        return epilogueLabel;
    }
}